

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigRefineClass_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pClass)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int local_44;
  Ivy_Obj_t *pIStack_40;
  int RetValue;
  Ivy_Obj_t *pNode;
  Ivy_Obj_t *pListNew;
  Ivy_Obj_t *pListOld;
  Ivy_Obj_t *pClassNew;
  Ivy_Obj_t *pClass_local;
  Ivy_FraigMan_t *p_local;
  
  local_44 = 0;
  pListOld = Ivy_ObjClassNodeNext(pClass);
  pListNew = pClass;
  do {
    if (pListOld == (Ivy_Obj_t *)0x0) {
LAB_00a23470:
      if (pListOld == (Ivy_Obj_t *)0x0) {
        p_local._4_4_ = 0;
      }
      else {
        Ivy_ObjSetClassNodeRepr(pListOld,(Ivy_Obj_t *)0x0);
        pNode = pListOld;
        for (pIStack_40 = Ivy_ObjClassNodeNext(pListOld); pIStack_40 != (Ivy_Obj_t *)0x0;
            pIStack_40 = Ivy_ObjClassNodeNext(pIStack_40)) {
          iVar1 = Ivy_NodeCompareSims(p,pClass,pIStack_40);
          if (iVar1 == 0) {
            Ivy_ObjSetClassNodeNext(pNode,pIStack_40);
            Ivy_ObjSetClassNodeRepr(pIStack_40,pListOld);
            pNode = pIStack_40;
          }
          else {
            Ivy_ObjSetClassNodeNext(pListNew,pIStack_40);
            pListNew = pIStack_40;
          }
        }
        Ivy_ObjSetClassNodeNext(pNode,(Ivy_Obj_t *)0x0);
        Ivy_ObjSetClassNodeNext(pListNew,(Ivy_Obj_t *)0x0);
        Ivy_FraigInsertClass(&p->lClasses,pClass,pListOld);
        pIVar2 = Ivy_ObjClassNodeNext(pClass);
        if (pIVar2 == (Ivy_Obj_t *)0x0) {
          Ivy_FraigRemoveClass(&p->lClasses,pClass);
        }
        pIVar2 = Ivy_ObjClassNodeNext(pListOld);
        if (pIVar2 == (Ivy_Obj_t *)0x0) {
          Ivy_FraigRemoveClass(&p->lClasses,pListOld);
        }
        else {
          local_44 = Ivy_FraigRefineClass_rec(p,pListOld);
        }
        p_local._4_4_ = local_44 + 1;
      }
      return p_local._4_4_;
    }
    iVar1 = Ivy_NodeCompareSims(p,pClass,pListOld);
    if (iVar1 == 0) {
      if (p->pParams->fPatScores != 0) {
        Ivy_FraigAddToPatScores(p,pClass,pListOld);
      }
      goto LAB_00a23470;
    }
    pListNew = pListOld;
    pListOld = Ivy_ObjClassNodeNext(pListOld);
  } while( true );
}

Assistant:

int Ivy_FraigRefineClass_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pClassNew, * pListOld, * pListNew, * pNode;
    int RetValue = 0;
    // check if there is refinement
    pListOld = pClass;
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClass), pClassNew )
    {
        if ( !Ivy_NodeCompareSims(p, pClass, pClassNew) )
        {
            if ( p->pParams->fPatScores )
                Ivy_FraigAddToPatScores( p, pClass, pClassNew );
            break;
        }
        pListOld = pClassNew;
    }
    if ( pClassNew == NULL )
        return 0;
    // set representative of the new class
    Ivy_ObjSetClassNodeRepr( pClassNew, NULL );
    // start the new list
    pListNew = pClassNew;
    // go through the remaining nodes and sort them into two groups:
    // (1) matches of the old node; (2) non-matches of the old node
    Ivy_FraigForEachClassNode( Ivy_ObjClassNodeNext(pClassNew), pNode )
        if ( Ivy_NodeCompareSims( p, pClass, pNode ) )
        {
            Ivy_ObjSetClassNodeNext( pListOld, pNode );
            pListOld = pNode;
        }
        else
        {
            Ivy_ObjSetClassNodeNext( pListNew, pNode );
            Ivy_ObjSetClassNodeRepr( pNode, pClassNew );
            pListNew = pNode;
        }
    // finish both lists
    Ivy_ObjSetClassNodeNext( pListNew, NULL );
    Ivy_ObjSetClassNodeNext( pListOld, NULL );
    // update the list of classes
    Ivy_FraigInsertClass( &p->lClasses, pClass, pClassNew );
    // if the old class is trivial, remove it
    if ( Ivy_ObjClassNodeNext(pClass) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClass );
    // if the new class is trivial, remove it; otherwise, try to refine it
    if ( Ivy_ObjClassNodeNext(pClassNew) == NULL )
        Ivy_FraigRemoveClass( &p->lClasses, pClassNew );
    else
        RetValue = Ivy_FraigRefineClass_rec( p, pClassNew );
    return RetValue + 1;
}